

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O2

string * extract_module_name_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  ulong uVar1;
  allocator<char> local_31;
  string module_name;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&module_name,name,&local_31);
  uVar1 = std::__cxx11::string::rfind((char *)&module_name,0x10a904);
  if (uVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GLOBAL",&local_31);
  }
  else {
    std::__cxx11::string::erase((ulong)&module_name,uVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)module_name._M_dataplus._M_p == &module_name.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(module_name.field_2._M_allocated_capacity._1_7_,
                    module_name.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = module_name.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = module_name._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(module_name.field_2._M_allocated_capacity._1_7_,
                    module_name.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = module_name._M_string_length;
    module_name._M_string_length = 0;
    module_name.field_2._M_local_buf[0] = '\0';
    module_name._M_dataplus._M_p = (pointer)&module_name.field_2;
  }
  std::__cxx11::string::~string((string *)&module_name);
  return __return_storage_ptr__;
}

Assistant:

string extract_module_name(const char* name) {
    string module_name = name;
    string::size_type pos = module_name.rfind("::");

    if ( pos == string::npos )
        return string(GLOBAL_MODULE_NAME);

    module_name.erase(pos);

    return module_name;
}